

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O1

REF_STATUS ref_matrix_m_full(REF_DBL *m,REF_DBL *full)

{
  *full = *m;
  full[3] = m[1];
  full[6] = m[2];
  full[1] = m[1];
  full[4] = m[3];
  full[7] = m[4];
  full[2] = m[2];
  full[5] = m[4];
  full[8] = m[5];
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_m_full(REF_DBL *m, REF_DBL *full) {
  full[0 + 0 * 3] = m[0];
  full[0 + 1 * 3] = m[1];
  full[0 + 2 * 3] = m[2];
  full[1 + 0 * 3] = m[1];
  full[1 + 1 * 3] = m[3];
  full[1 + 2 * 3] = m[4];
  full[2 + 0 * 3] = m[2];
  full[2 + 1 * 3] = m[4];
  full[2 + 2 * 3] = m[5];
  return REF_SUCCESS;
}